

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

void icetCompressedSubComposite
               (IceTImage destBuffer,IceTSizeType offset,IceTSparseImage srcBuffer,int srcOnTop)

{
  IceTFloat IVar1;
  IceTFloat IVar2;
  int iVar3;
  float fVar4;
  IceTEnum IVar5;
  IceTEnum IVar6;
  IceTSizeType IVar7;
  int iVar8;
  IceTFloat *pIVar9;
  IceTUInt *pIVar10;
  float *pfVar11;
  float fVar12;
  IceTFloat afactor_3;
  IceTSizeType _rl_9;
  IceTVoid *_runlengths_9;
  int local_2e8;
  IceTSizeType _i_9;
  IceTSizeType _p_9;
  IceTSizeType _pixels_9;
  IceTByte *_src_9;
  IceTFloat _background_color_7 [4];
  IceTFloat *_c_in_7;
  IceTFloat *_color_7;
  IceTUInt afactor_2;
  IceTSizeType _rl_8;
  IceTVoid *_runlengths_8;
  int local_298;
  IceTSizeType _i_8;
  IceTSizeType _p_8;
  IceTSizeType _pixels_8;
  IceTByte *_src_8;
  byte *pbStack_280;
  IceTUInt _background_color_6;
  IceTUInt *_c_in_6;
  IceTUInt *_color_6;
  float *pfStack_268;
  IceTSizeType _rl_7;
  IceTVoid *_runlengths_7;
  int local_258;
  IceTSizeType _i_7;
  IceTSizeType _p_7;
  IceTSizeType _pixels_7;
  IceTByte *_src_7;
  IceTFloat *_d_in_5;
  IceTFloat *pIStack_238;
  IceTSizeType _rl_6;
  IceTVoid *_runlengths_6;
  int local_228;
  IceTSizeType _i_6;
  IceTSizeType _p_6;
  IceTSizeType _pixels_6;
  IceTByte *_src_6;
  IceTFloat _background_color_5 [4];
  IceTFloat *_d_in_4;
  IceTFloat *_c_in_5;
  IceTFloat *_color_5;
  IceTSizeType _rl_5;
  IceTVoid *_runlengths_5;
  int local_1d8;
  IceTSizeType _i_5;
  IceTSizeType _p_5;
  IceTSizeType _pixels_5;
  IceTByte *_src_5;
  float *pfStack_1c0;
  IceTUInt _background_color_4;
  IceTFloat *_d_in_3;
  IceTUInt *_c_in_4;
  IceTUInt *_color_4;
  IceTFloat *_depth_1;
  IceTEnum _composite_mode_1;
  IceTSizeType _pixel_count_1;
  IceTEnum _depth_format_1;
  IceTEnum _color_format_1;
  IceTFloat afactor_1;
  IceTSizeType _rl_4;
  IceTVoid *_runlengths_4;
  int local_178;
  IceTSizeType _i_4;
  IceTSizeType _p_4;
  IceTSizeType _pixels_4;
  IceTByte *_src_4;
  IceTFloat _background_color_3 [4];
  IceTFloat *_c_in_3;
  IceTFloat *_color_3;
  IceTUInt afactor;
  IceTSizeType _rl_3;
  IceTVoid *_runlengths_3;
  int local_128;
  IceTSizeType _i_3;
  IceTSizeType _p_3;
  IceTSizeType _pixels_3;
  IceTByte *_src_3;
  int *piStack_110;
  IceTUInt _background_color_2;
  IceTUInt *_c_in_2;
  IceTUInt *_color_2;
  float *pfStack_f8;
  IceTSizeType _rl_2;
  IceTVoid *_runlengths_2;
  int local_e8;
  IceTSizeType _i_2;
  IceTSizeType _p_2;
  IceTSizeType _pixels_2;
  IceTByte *_src_2;
  IceTFloat *_d_in_2;
  IceTFloat *pIStack_c8;
  IceTSizeType _rl_1;
  IceTVoid *_runlengths_1;
  int local_b8;
  IceTSizeType _i_1;
  IceTSizeType _p_1;
  IceTSizeType _pixels_1;
  IceTByte *_src_1;
  IceTFloat _background_color_1 [4];
  IceTFloat *_d_in_1;
  IceTFloat *_c_in_1;
  IceTFloat *_color_1;
  IceTSizeType _rl;
  IceTVoid *_runlengths;
  int local_68;
  IceTSizeType _i;
  IceTSizeType _p;
  IceTSizeType _pixels;
  IceTByte *_src;
  float *pfStack_50;
  IceTUInt _background_color;
  IceTFloat *_d_in;
  IceTUInt *_c_in;
  IceTUInt *_color;
  IceTFloat *_depth;
  IceTEnum _composite_mode;
  IceTSizeType _pixel_count;
  IceTEnum _depth_format;
  IceTEnum _color_format;
  int srcOnTop_local;
  IceTSizeType offset_local;
  IceTSparseImage srcBuffer_local;
  IceTImage destBuffer_local;
  
  _depth_format = srcOnTop;
  _color_format = offset;
  _srcOnTop_local = srcBuffer.opaque_internals;
  srcBuffer_local.opaque_internals = destBuffer.opaque_internals;
  icetTimingBlendBegin();
  if (_depth_format == 0) {
    icetGetEnumv(0x28,(IceTEnum *)&_depth_1);
    _pixel_count_1 = icetSparseImageGetColorFormat(_srcOnTop_local);
    _composite_mode_1 = icetSparseImageGetDepthFormat(_srcOnTop_local);
    _depth_1._4_4_ = icetSparseImageGetNumPixels(_srcOnTop_local);
    IVar7 = _pixel_count_1;
    IVar6 = icetImageGetColorFormat((IceTImage)srcBuffer_local.opaque_internals);
    IVar5 = _composite_mode_1;
    if ((((IVar7 != IVar6) ||
         (IVar6 = icetImageGetDepthFormat((IceTImage)srcBuffer_local.opaque_internals),
         iVar3 = _depth_1._4_4_, IVar5 != IVar6)) ||
        (IVar7 = icetSparseImageGetNumPixels(_srcOnTop_local), iVar8 = _depth_1._4_4_,
        iVar3 != IVar7)) ||
       (IVar7 = icetImageGetNumPixels((IceTImage)srcBuffer_local.opaque_internals),
       (int)(IVar7 - _color_format) < iVar8)) {
      icetRaiseDiagnostic("Input/output buffers do not agree for decompression.",0xffffffff,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
                          ,0x58);
    }
    if ((int)_depth_1 == 0x301) {
      if (_composite_mode_1 == 0xd001) {
        pIVar9 = icetImageGetDepthf((IceTImage)srcBuffer_local.opaque_internals);
        _color_4 = (IceTUInt *)(pIVar9 + (int)_color_format);
        if (_pixel_count_1 == 0xc001) {
          pIVar10 = icetImageGetColorui((IceTImage)srcBuffer_local.opaque_internals);
          _c_in_4 = pIVar10 + (int)_color_format;
          icetGetIntegerv(6,(IceTInt *)((long)&_src_5 + 4));
          IVar7 = icetSparseImageGetNumPixels(_srcOnTop_local);
          __p_5 = (IceTFloat *)((long)_srcOnTop_local + 0x1c);
          local_1d8 = 0;
          while (local_1d8 < IVar7) {
            IVar1 = *__p_5;
            if (IVar7 < (int)IVar1 + local_1d8) {
              icetRaiseDiagnostic("Corrupt compressed image.",0xfffffffa,1,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
                                  ,0x3a);
              break;
            }
            _c_in_4 = _c_in_4 + (int)IVar1;
            _color_4 = _color_4 + (int)IVar1;
            IVar2 = __p_5[1];
            local_1d8 = (int)IVar2 + (int)IVar1 + local_1d8;
            if (IVar7 < local_1d8) {
              icetRaiseDiagnostic("Corrupt compressed image.",0xfffffffa,1,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
                                  ,0x43);
              break;
            }
            pIVar9 = __p_5;
            for (_runlengths_5._4_4_ = 0; __p_5 = pIVar9 + 2, _runlengths_5._4_4_ < (int)IVar2;
                _runlengths_5._4_4_ = _runlengths_5._4_4_ + 1) {
              _d_in_3 = __p_5;
              pfStack_1c0 = (float *)(pIVar9 + 3);
              if (*pfStack_1c0 < (float)*_color_4) {
                *_c_in_4 = (IceTUInt)*__p_5;
                *_color_4 = (IceTUInt)*pfStack_1c0;
              }
              _c_in_4 = _c_in_4 + 1;
              _color_4 = _color_4 + 1;
              pIVar9 = __p_5;
            }
          }
        }
        else if (_pixel_count_1 == 0xc002) {
          pIVar9 = icetImageGetColorf((IceTImage)srcBuffer_local.opaque_internals);
          _c_in_5 = pIVar9 + (int)(_color_format << 2);
          icetGetFloatv(5,(IceTFloat *)&_src_6);
          _i_6 = icetSparseImageGetNumPixels(_srcOnTop_local);
          __p_6 = (IceTFloat *)((long)_srcOnTop_local + 0x1c);
          local_228 = 0;
          while (local_228 < _i_6) {
            pIStack_238 = __p_6;
            pIVar9 = __p_6 + 2;
            _d_in_5._4_4_ = *__p_6;
            local_228 = (int)_d_in_5._4_4_ + local_228;
            if (_i_6 < local_228) {
              __p_6 = pIVar9;
              icetRaiseDiagnostic("Corrupt compressed image.",0xfffffffa,1,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
                                  ,0x3a);
              break;
            }
            _c_in_5 = _c_in_5 + ((int)_d_in_5._4_4_ << 2);
            _color_4 = _color_4 + (int)_d_in_5._4_4_;
            _d_in_5._4_4_ = __p_6[1];
            local_228 = (int)_d_in_5._4_4_ + local_228;
            if (_i_6 < local_228) {
              __p_6 = pIVar9;
              icetRaiseDiagnostic("Corrupt compressed image.",0xfffffffa,1,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
                                  ,0x43);
              break;
            }
            __p_6 = pIVar9;
            for (_runlengths_6._4_4_ = 0; _runlengths_6._4_4_ < (int)_d_in_5._4_4_;
                _runlengths_6._4_4_ = _runlengths_6._4_4_ + 1) {
              _background_color_5._8_8_ = __p_6 + 4;
              if (*(float *)_background_color_5._8_8_ < (float)*_color_4) {
                *_c_in_5 = *__p_6;
                _c_in_5[1] = __p_6[1];
                _c_in_5[2] = __p_6[2];
                _c_in_5[3] = __p_6[3];
                *_color_4 = (IceTUInt)*(float *)_background_color_5._8_8_;
              }
              _c_in_5 = _c_in_5 + 4;
              _color_4 = _color_4 + 1;
              __p_6 = __p_6 + 5;
            }
          }
        }
        else if (_pixel_count_1 == 0xc000) {
          _i_7 = icetSparseImageGetNumPixels(_srcOnTop_local);
          __p_7 = (float *)((long)_srcOnTop_local + 0x1c);
          local_258 = 0;
          while (local_258 < _i_7) {
            pfStack_268 = __p_7;
            pfVar11 = __p_7 + 2;
            _color_6._4_4_ = *__p_7;
            local_258 = (int)_color_6._4_4_ + local_258;
            if (_i_7 < local_258) {
              __p_7 = pfVar11;
              icetRaiseDiagnostic("Corrupt compressed image.",0xfffffffa,1,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
                                  ,0x3a);
              break;
            }
            _color_4 = _color_4 + (int)_color_6._4_4_;
            _color_6._4_4_ = __p_7[1];
            local_258 = (int)_color_6._4_4_ + local_258;
            if (_i_7 < local_258) {
              __p_7 = pfVar11;
              icetRaiseDiagnostic("Corrupt compressed image.",0xfffffffa,1,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
                                  ,0x43);
              break;
            }
            __p_7 = pfVar11;
            for (_runlengths_7._4_4_ = 0; _runlengths_7._4_4_ < (int)_color_6._4_4_;
                _runlengths_7._4_4_ = _runlengths_7._4_4_ + 1) {
              _src_7 = (IceTByte *)__p_7;
              if (*__p_7 < (float)*_color_4) {
                *_color_4 = (IceTUInt)*__p_7;
              }
              _color_4 = _color_4 + 1;
              __p_7 = __p_7 + 1;
            }
          }
        }
        else {
          icetRaiseDiagnostic("Encountered invalid color format.",0xffffffff,1,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
                              ,0xe2);
        }
      }
      else if (_composite_mode_1 == 0xd000) {
        icetRaiseDiagnostic("Cannot use Z buffer compositing operation with no Z buffer.",0xfffffffb
                            ,1,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
                            ,0xe6);
      }
      else {
        icetRaiseDiagnostic("Encountered invalid depth format.",0xffffffff,1,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
                            ,0xe9);
      }
    }
    else if ((int)_depth_1 == 0x302) {
      if (_composite_mode_1 != 0xd000) {
        icetRaiseDiagnostic("Z buffer ignored during blend composite operation.  Output z buffer meaningless."
                            ,0xfffffffa,3,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
                            ,0xf0);
      }
      if (_pixel_count_1 == 0xc001) {
        pIVar10 = icetImageGetColorui((IceTImage)srcBuffer_local.opaque_internals);
        _c_in_6 = pIVar10 + (int)_color_format;
        icetGetIntegerv(6,(IceTInt *)((long)&_src_8 + 4));
        IVar7 = icetSparseImageGetNumPixels(_srcOnTop_local);
        __p_8 = (byte *)((long)_srcOnTop_local + 0x1c);
        local_298 = 0;
        while (local_298 < IVar7) {
          local_298 = *(int *)__p_8 + local_298;
          if (IVar7 < local_298) {
            icetRaiseDiagnostic("Corrupt compressed image.",0xfffffffa,1,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
                                ,0x3a);
            break;
          }
          _c_in_6 = _c_in_6 + *(int *)__p_8;
          iVar3 = *(int *)(__p_8 + 4);
          local_298 = iVar3 + local_298;
          if (IVar7 < local_298) {
            icetRaiseDiagnostic("Corrupt compressed image.",0xfffffffa,1,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
                                ,0x43);
            break;
          }
          __p_8 = __p_8 + 8;
          for (_runlengths_8._4_4_ = 0; _runlengths_8._4_4_ < iVar3;
              _runlengths_8._4_4_ = _runlengths_8._4_4_ + 1) {
            pbStack_280 = __p_8;
            iVar8 = 0xff - (uint)*(byte *)((long)_c_in_6 + 3);
            *(char *)_c_in_6 = (char)((ulong)((uint)*__p_8 * iVar8) / 0xff) + (char)*_c_in_6;
            *(char *)((long)_c_in_6 + 1) =
                 (char)((ulong)((uint)__p_8[1] * iVar8) / 0xff) + *(char *)((long)_c_in_6 + 1);
            *(char *)((long)_c_in_6 + 2) =
                 (char)((ulong)((uint)__p_8[2] * iVar8) / 0xff) + *(char *)((long)_c_in_6 + 2);
            *(char *)((long)_c_in_6 + 3) =
                 (char)((ulong)((uint)__p_8[3] * iVar8) / 0xff) + *(char *)((long)_c_in_6 + 3);
            _c_in_6 = _c_in_6 + 1;
            __p_8 = __p_8 + 4;
          }
        }
      }
      else if (_pixel_count_1 == 0xc002) {
        pIVar9 = icetImageGetColorf((IceTImage)srcBuffer_local.opaque_internals);
        _c_in_7 = pIVar9 + (int)(_color_format << 2);
        icetGetFloatv(5,(IceTFloat *)&_src_9);
        IVar7 = icetSparseImageGetNumPixels(_srcOnTop_local);
        __p_9 = (float *)((long)_srcOnTop_local + 0x1c);
        local_2e8 = 0;
        while (local_2e8 < IVar7) {
          local_2e8 = (int)*__p_9 + local_2e8;
          if (IVar7 < local_2e8) {
            icetRaiseDiagnostic("Corrupt compressed image.",0xfffffffa,1,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
                                ,0x3a);
            break;
          }
          _c_in_7 = _c_in_7 + ((int)*__p_9 << 2);
          fVar4 = __p_9[1];
          local_2e8 = (int)fVar4 + local_2e8;
          if (IVar7 < local_2e8) {
            icetRaiseDiagnostic("Corrupt compressed image.",0xfffffffa,1,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
                                ,0x43);
            break;
          }
          __p_9 = __p_9 + 2;
          for (_runlengths_9._4_4_ = 0; _runlengths_9._4_4_ < (int)fVar4;
              _runlengths_9._4_4_ = _runlengths_9._4_4_ + 1) {
            fVar12 = 1.0 - (float)_c_in_7[3];
            *_c_in_7 = (IceTFloat)(*__p_9 * fVar12 + (float)*_c_in_7);
            _c_in_7[1] = (IceTFloat)(__p_9[1] * fVar12 + (float)_c_in_7[1]);
            _c_in_7[2] = (IceTFloat)(__p_9[2] * fVar12 + (float)_c_in_7[2]);
            _c_in_7[3] = (IceTFloat)(__p_9[3] * fVar12 + (float)_c_in_7[3]);
            _c_in_7 = _c_in_7 + 4;
            __p_9 = __p_9 + 4;
          }
        }
      }
      else if (_pixel_count_1 == 0xc000) {
        icetRaiseDiagnostic("Decompressing image with no data.",0xfffffffb,3,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
                            ,0x13f);
      }
      else {
        icetRaiseDiagnostic("Encountered invalid color format.",0xffffffff,1,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
                            ,0x142);
      }
    }
    else {
      icetRaiseDiagnostic("Encountered invalid composite mode.",0xffffffff,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
                          ,0x146);
    }
  }
  else {
    icetGetEnumv(0x28,(IceTEnum *)&_depth);
    _pixel_count = icetSparseImageGetColorFormat(_srcOnTop_local);
    _composite_mode = icetSparseImageGetDepthFormat(_srcOnTop_local);
    _depth._4_4_ = icetSparseImageGetNumPixels(_srcOnTop_local);
    IVar7 = _pixel_count;
    IVar6 = icetImageGetColorFormat((IceTImage)srcBuffer_local.opaque_internals);
    IVar5 = _composite_mode;
    if (((IVar7 != IVar6) ||
        (IVar6 = icetImageGetDepthFormat((IceTImage)srcBuffer_local.opaque_internals),
        iVar3 = _depth._4_4_, IVar5 != IVar6)) ||
       ((IVar7 = icetSparseImageGetNumPixels(_srcOnTop_local), iVar8 = _depth._4_4_, iVar3 != IVar7
        || (IVar7 = icetImageGetNumPixels((IceTImage)srcBuffer_local.opaque_internals),
           (int)(IVar7 - _color_format) < iVar8)))) {
      icetRaiseDiagnostic("Input/output buffers do not agree for decompression.",0xffffffff,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
                          ,0x58);
    }
    if ((int)_depth == 0x301) {
      if (_composite_mode == 0xd001) {
        pIVar9 = icetImageGetDepthf((IceTImage)srcBuffer_local.opaque_internals);
        _color = (IceTUInt *)(pIVar9 + (int)_color_format);
        if (_pixel_count == 0xc001) {
          pIVar10 = icetImageGetColorui((IceTImage)srcBuffer_local.opaque_internals);
          _c_in = pIVar10 + (int)_color_format;
          icetGetIntegerv(6,(IceTInt *)((long)&_src + 4));
          IVar7 = icetSparseImageGetNumPixels(_srcOnTop_local);
          __p = (IceTFloat *)((long)_srcOnTop_local + 0x1c);
          local_68 = 0;
          while (local_68 < IVar7) {
            IVar1 = *__p;
            if (IVar7 < (int)IVar1 + local_68) {
              icetRaiseDiagnostic("Corrupt compressed image.",0xfffffffa,1,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
                                  ,0x3a);
              break;
            }
            _c_in = _c_in + (int)IVar1;
            _color = _color + (int)IVar1;
            IVar2 = __p[1];
            local_68 = (int)IVar2 + (int)IVar1 + local_68;
            if (IVar7 < local_68) {
              icetRaiseDiagnostic("Corrupt compressed image.",0xfffffffa,1,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
                                  ,0x43);
              break;
            }
            pIVar9 = __p;
            for (_runlengths._4_4_ = 0; __p = pIVar9 + 2, _runlengths._4_4_ < (int)IVar2;
                _runlengths._4_4_ = _runlengths._4_4_ + 1) {
              _d_in = __p;
              pfStack_50 = (float *)(pIVar9 + 3);
              if (*pfStack_50 < (float)*_color) {
                *_c_in = (IceTUInt)*__p;
                *_color = (IceTUInt)*pfStack_50;
              }
              _c_in = _c_in + 1;
              _color = _color + 1;
              pIVar9 = __p;
            }
          }
        }
        else if (_pixel_count == 0xc002) {
          pIVar9 = icetImageGetColorf((IceTImage)srcBuffer_local.opaque_internals);
          _c_in_1 = pIVar9 + (int)(_color_format << 2);
          icetGetFloatv(5,(IceTFloat *)&_src_1);
          _i_1 = icetSparseImageGetNumPixels(_srcOnTop_local);
          __p_1 = (IceTFloat *)((long)_srcOnTop_local + 0x1c);
          local_b8 = 0;
          while (local_b8 < _i_1) {
            pIStack_c8 = __p_1;
            pIVar9 = __p_1 + 2;
            _d_in_2._4_4_ = *__p_1;
            local_b8 = (int)_d_in_2._4_4_ + local_b8;
            if (_i_1 < local_b8) {
              __p_1 = pIVar9;
              icetRaiseDiagnostic("Corrupt compressed image.",0xfffffffa,1,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
                                  ,0x3a);
              break;
            }
            _c_in_1 = _c_in_1 + ((int)_d_in_2._4_4_ << 2);
            _color = _color + (int)_d_in_2._4_4_;
            _d_in_2._4_4_ = __p_1[1];
            local_b8 = (int)_d_in_2._4_4_ + local_b8;
            if (_i_1 < local_b8) {
              __p_1 = pIVar9;
              icetRaiseDiagnostic("Corrupt compressed image.",0xfffffffa,1,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
                                  ,0x43);
              break;
            }
            __p_1 = pIVar9;
            for (_runlengths_1._4_4_ = 0; _runlengths_1._4_4_ < (int)_d_in_2._4_4_;
                _runlengths_1._4_4_ = _runlengths_1._4_4_ + 1) {
              _background_color_1._8_8_ = __p_1 + 4;
              if (*(float *)_background_color_1._8_8_ < (float)*_color) {
                *_c_in_1 = *__p_1;
                _c_in_1[1] = __p_1[1];
                _c_in_1[2] = __p_1[2];
                _c_in_1[3] = __p_1[3];
                *_color = (IceTUInt)*(float *)_background_color_1._8_8_;
              }
              _c_in_1 = _c_in_1 + 4;
              _color = _color + 1;
              __p_1 = __p_1 + 5;
            }
          }
        }
        else if (_pixel_count == 0xc000) {
          _i_2 = icetSparseImageGetNumPixels(_srcOnTop_local);
          __p_2 = (float *)((long)_srcOnTop_local + 0x1c);
          local_e8 = 0;
          while (local_e8 < _i_2) {
            pfStack_f8 = __p_2;
            pfVar11 = __p_2 + 2;
            _color_2._4_4_ = *__p_2;
            local_e8 = (int)_color_2._4_4_ + local_e8;
            if (_i_2 < local_e8) {
              __p_2 = pfVar11;
              icetRaiseDiagnostic("Corrupt compressed image.",0xfffffffa,1,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
                                  ,0x3a);
              break;
            }
            _color = _color + (int)_color_2._4_4_;
            _color_2._4_4_ = __p_2[1];
            local_e8 = (int)_color_2._4_4_ + local_e8;
            if (_i_2 < local_e8) {
              __p_2 = pfVar11;
              icetRaiseDiagnostic("Corrupt compressed image.",0xfffffffa,1,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
                                  ,0x43);
              break;
            }
            __p_2 = pfVar11;
            for (_runlengths_2._4_4_ = 0; _runlengths_2._4_4_ < (int)_color_2._4_4_;
                _runlengths_2._4_4_ = _runlengths_2._4_4_ + 1) {
              _src_2 = (IceTByte *)__p_2;
              if (*__p_2 < (float)*_color) {
                *_color = (IceTUInt)*__p_2;
              }
              _color = _color + 1;
              __p_2 = __p_2 + 1;
            }
          }
        }
        else {
          icetRaiseDiagnostic("Encountered invalid color format.",0xffffffff,1,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
                              ,0xe2);
        }
      }
      else if (_composite_mode == 0xd000) {
        icetRaiseDiagnostic("Cannot use Z buffer compositing operation with no Z buffer.",0xfffffffb
                            ,1,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
                            ,0xe6);
      }
      else {
        icetRaiseDiagnostic("Encountered invalid depth format.",0xffffffff,1,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
                            ,0xe9);
      }
    }
    else if ((int)_depth == 0x302) {
      if (_composite_mode != 0xd000) {
        icetRaiseDiagnostic("Z buffer ignored during blend composite operation.  Output z buffer meaningless."
                            ,0xfffffffa,3,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
                            ,0xf0);
      }
      if (_pixel_count == 0xc001) {
        pIVar10 = icetImageGetColorui((IceTImage)srcBuffer_local.opaque_internals);
        _c_in_2 = pIVar10 + (int)_color_format;
        icetGetIntegerv(6,(IceTInt *)((long)&_src_3 + 4));
        IVar7 = icetSparseImageGetNumPixels(_srcOnTop_local);
        __p_3 = (int *)((long)_srcOnTop_local + 0x1c);
        local_128 = 0;
        while (local_128 < IVar7) {
          local_128 = *__p_3 + local_128;
          if (IVar7 < local_128) {
            icetRaiseDiagnostic("Corrupt compressed image.",0xfffffffa,1,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
                                ,0x3a);
            break;
          }
          _c_in_2 = _c_in_2 + *__p_3;
          iVar3 = __p_3[1];
          local_128 = iVar3 + local_128;
          if (IVar7 < local_128) {
            icetRaiseDiagnostic("Corrupt compressed image.",0xfffffffa,1,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
                                ,0x43);
            break;
          }
          __p_3 = __p_3 + 2;
          for (_runlengths_3._4_4_ = 0; _runlengths_3._4_4_ < iVar3;
              _runlengths_3._4_4_ = _runlengths_3._4_4_ + 1) {
            piStack_110 = __p_3;
            iVar8 = 0xff - (uint)*(byte *)((long)__p_3 + 3);
            *(char *)_c_in_2 = (char)((ulong)((uint)(byte)*_c_in_2 * iVar8) / 0xff) + (char)*__p_3;
            *(char *)((long)_c_in_2 + 1) =
                 (char)((ulong)((uint)*(byte *)((long)_c_in_2 + 1) * iVar8) / 0xff) +
                 *(char *)((long)__p_3 + 1);
            *(char *)((long)_c_in_2 + 2) =
                 (char)((ulong)((uint)*(byte *)((long)_c_in_2 + 2) * iVar8) / 0xff) +
                 *(char *)((long)__p_3 + 2);
            *(char *)((long)_c_in_2 + 3) =
                 (char)((ulong)((uint)*(byte *)((long)_c_in_2 + 3) * iVar8) / 0xff) +
                 *(char *)((long)__p_3 + 3);
            _c_in_2 = _c_in_2 + 1;
            __p_3 = __p_3 + 1;
          }
        }
      }
      else if (_pixel_count == 0xc002) {
        pIVar9 = icetImageGetColorf((IceTImage)srcBuffer_local.opaque_internals);
        _c_in_3 = pIVar9 + (int)(_color_format << 2);
        icetGetFloatv(5,(IceTFloat *)&_src_4);
        _i_4 = icetSparseImageGetNumPixels(_srcOnTop_local);
        __p_4 = (float *)((long)_srcOnTop_local + 0x1c);
        local_178 = 0;
        while (local_178 < _i_4) {
          _afactor_1 = __p_4;
          pfVar11 = __p_4 + 2;
          _color_format_1 = (IceTEnum)*__p_4;
          local_178 = _color_format_1 + local_178;
          if (_i_4 < local_178) {
            __p_4 = pfVar11;
            icetRaiseDiagnostic("Corrupt compressed image.",0xfffffffa,1,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
                                ,0x3a);
            break;
          }
          _c_in_3 = _c_in_3 + (int)(_color_format_1 << 2);
          _color_format_1 = (IceTEnum)__p_4[1];
          local_178 = _color_format_1 + local_178;
          if (_i_4 < local_178) {
            __p_4 = pfVar11;
            icetRaiseDiagnostic("Corrupt compressed image.",0xfffffffa,1,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
                                ,0x43);
            break;
          }
          __p_4 = pfVar11;
          for (_runlengths_4._4_4_ = 0; _runlengths_4._4_4_ < (int)_color_format_1;
              _runlengths_4._4_4_ = _runlengths_4._4_4_ + 1) {
            _depth_format_1 = (IceTEnum)(1.0 - __p_4[3]);
            *_c_in_3 = (IceTFloat)((float)*_c_in_3 * (float)_depth_format_1 + *__p_4);
            _c_in_3[1] = (IceTFloat)((float)_c_in_3[1] * (float)_depth_format_1 + __p_4[1]);
            _c_in_3[2] = (IceTFloat)((float)_c_in_3[2] * (float)_depth_format_1 + __p_4[2]);
            _c_in_3[3] = (IceTFloat)((float)_c_in_3[3] * (float)_depth_format_1 + __p_4[3]);
            _c_in_3 = _c_in_3 + 4;
            __p_4 = __p_4 + 4;
          }
        }
      }
      else if (_pixel_count == 0xc000) {
        icetRaiseDiagnostic("Decompressing image with no data.",0xfffffffb,3,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
                            ,0x13f);
      }
      else {
        icetRaiseDiagnostic("Encountered invalid color format.",0xffffffff,1,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
                            ,0x142);
      }
    }
    else {
      icetRaiseDiagnostic("Encountered invalid composite mode.",0xffffffff,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
                          ,0x146);
    }
  }
  icetTimingBlendEnd();
  return;
}

Assistant:

void icetCompressedSubComposite(IceTImage destBuffer,
                                IceTSizeType offset,
                                const IceTSparseImage srcBuffer,
                                int srcOnTop)
{
    icetTimingBlendBegin();

    if (srcOnTop) {
#define INPUT_SPARSE_IMAGE      srcBuffer
#define OUTPUT_IMAGE            destBuffer
#define OFFSET                  offset
#define PIXEL_COUNT             icetSparseImageGetNumPixels(srcBuffer)
#define COMPOSITE
#define BLEND_RGBA_UBYTE        ICET_OVER_UBYTE
#define BLEND_RGBA_FLOAT        ICET_OVER_FLOAT
#include "decompress_func_body.h"
    } else {
#define INPUT_SPARSE_IMAGE      srcBuffer
#define OUTPUT_IMAGE            destBuffer
#define OFFSET                  offset
#define PIXEL_COUNT             icetSparseImageGetNumPixels(srcBuffer)
#define COMPOSITE
#define BLEND_RGBA_UBYTE        ICET_UNDER_UBYTE
#define BLEND_RGBA_FLOAT        ICET_UNDER_FLOAT
#include "decompress_func_body.h"
    }

    icetTimingBlendEnd();
}